

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O3

void __thiscall
PatternAddressMapper::export_pattern_internal
          (PatternAddressMapper *this,vector<Aggressor,_std::allocator<Aggressor>_> *aggressors,
          int base_period,vector<volatile_char_*,_std::allocator<volatile_char_*>_> *addresses,
          vector<int,_std::allocator<int>_> *rows)

{
  iterator __position;
  const_iterator cVar1;
  iterator iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  pointer pAVar5;
  undefined8 extraout_RDX;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  ulong uVar6;
  stringstream local_230 [8];
  stringstream pattern_str;
  undefined1 local_220 [376];
  ulong local_a8;
  vector<char_volatile*,std::allocator<char_volatile*>> *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  vector<Aggressor,_std::allocator<Aggressor>_> *local_90;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  string local_80;
  ulong local_60;
  int local_54;
  undefined1 auStack_50 [4];
  value_type agg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a0 = (vector<char_volatile*,std::allocator<char_volatile*>> *)addresses;
  local_98 = rows;
  std::__cxx11::stringstream::stringstream(local_230);
  pAVar5 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
      super__Vector_impl_data._M_finish != pAVar5) {
    local_a8 = (ulong)base_period;
    this_00 = &(this->aggressor_to_addr)._M_h;
    uVar6 = 0;
    local_60 = 0;
    local_90 = aggressors;
    local_88 = this_00;
    do {
      while( true ) {
        if ((uVar6 != 0) && (uVar6 % local_a8 == 0)) {
          std::ios::widen((char)*(_func_int **)(local_220._0_8_ + -0x18) + (char)local_220);
          std::ostream::put((char)local_220);
          std::ostream::flush();
          pAVar5 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        local_54 = pAVar5[uVar6].id;
        if (local_54 == -1) break;
        cVar1 = std::
                _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,&local_54);
        if (cVar1.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur !=
            (__node_type *)0x0) {
          iVar2 = std::
                  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,&local_54);
          if (iVar2.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur !=
              (__node_type *)0x0) {
            _auStack_50 = (pointer)DRAMAddr::to_virt((DRAMAddr *)
                                                     ((long)iVar2.
                                                  super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>
                                                  ._M_cur + 0x10));
            std::vector<char_volatile*,std::allocator<char_volatile*>>::emplace_back<char_volatile*>
                      (local_a0,(char **)auStack_50);
            iVar2 = std::
                    _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,&local_54);
            if (iVar2.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur ==
                (__node_type *)0x0) goto LAB_0013c63b;
            auStack_50 = (undefined1  [4])
                         *(int *)((long)iVar2.
                                        super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>
                                        ._M_cur + 0x18);
            __position._M_current =
                 (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_98,__position,(int *)auStack_50);
            }
            else {
              *__position._M_current =
                   *(int *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>.
                                  _M_cur + 0x18);
              (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar2 = std::
                    _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,&local_54);
            if (iVar2.super__Node_iterator_base<std::pair<const_int,_DRAMAddr>,_false>._M_cur !=
                (__node_type *)0x0) {
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_220);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              goto LAB_0013c4ea;
            }
            std::__throw_out_of_range("_Map_base::at");
          }
          std::__throw_out_of_range("_Map_base::at");
LAB_0013c63b:
          uVar4 = std::__throw_out_of_range("_Map_base::at");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_auStack_50 != &local_40) {
            operator_delete(_auStack_50,local_40._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_230);
          std::ios_base::~ios_base((ios_base *)(local_220 + 0x70));
          _Unwind_Resume(uVar4);
        }
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,
                   "Could not find a valid address mapping for aggressor with ID %d.","");
        format_string<int>((string *)auStack_50,&local_80,local_54);
        Logger::log_error((string *)auStack_50,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_auStack_50 != &local_40) {
          operator_delete(_auStack_50,local_40._M_allocated_capacity + 1);
        }
        this_00 = local_88;
        aggressors = local_90;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          this_00 = local_88;
          aggressors = local_90;
        }
LAB_0013c4ea:
        uVar6 = uVar6 + 1;
        pAVar5 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 2) <= uVar6) {
          if ((local_60 & 1) == 0) goto LAB_0013c5f2;
          goto LAB_0013c576;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\x1b[0;31m",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"-1",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"\x1b[0m",4);
      uVar6 = uVar6 + 1;
      pAVar5 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    } while (uVar6 < (ulong)((long)(aggressors->
                                   super__Vector_base<Aggressor,_std::allocator<Aggressor>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 2));
LAB_0013c576:
    _auStack_50 = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_50,
               "Found at least an invalid aggressor in the pattern. These aggressors were NOT added but printed to visualize their position."
               ,"");
    Logger::log_error((string *)auStack_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_auStack_50 != &local_40) {
      operator_delete(_auStack_50,local_40._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    Logger::log_data((string *)auStack_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_auStack_50 != &local_40) {
      operator_delete(_auStack_50,local_40._M_allocated_capacity + 1);
    }
  }
LAB_0013c5f2:
  std::__cxx11::stringstream::~stringstream(local_230);
  std::ios_base::~ios_base((ios_base *)(local_220 + 0x70));
  return;
}

Assistant:

void PatternAddressMapper::export_pattern_internal(
    std::vector<Aggressor> &aggressors, int base_period,
    std::vector<volatile char *> &addresses,
    std::vector<int> &rows) {

  bool invalid_aggs = false;
  std::stringstream pattern_str;
  for (size_t i = 0; i < aggressors.size(); ++i) {
    // for better visualization: add linebreak after each base period
    if (i!=0 && (i%base_period)==0) {
      pattern_str << std::endl;
    }

    // check whether this is a valid aggressor, i.e., the aggressor's ID != -1
    auto agg = aggressors[i];
    if (agg.id==ID_PLACEHOLDER_AGG) {
      pattern_str << FC_RED << "-1" << F_RESET;
      invalid_aggs = true;
      continue;
    }

    // check whether there exists a aggressor ID -> address mapping before trying to access it
    if (aggressor_to_addr.count(agg.id)==0) {
      Logger::log_error(format_string("Could not find a valid address mapping for aggressor with ID %d.", agg.id));
      continue;
    }

    // retrieve virtual address of current aggressor in pattern and add it to output vector
    addresses.push_back((volatile char *) aggressor_to_addr.at(agg.id).to_virt());
    rows.push_back(static_cast<int>(aggressor_to_addr.at(agg.id).row));
    pattern_str << aggressor_to_addr.at(agg.id).row << " ";
  }

  // print string representation of pattern
//  Logger::log_info("Pattern filled by random DRAM rows:");
//  Logger::log_data(pattern_str.str());

  if (invalid_aggs) {
    Logger::log_error(
        "Found at least an invalid aggressor in the pattern. "
        "These aggressors were NOT added but printed to visualize their position.");
    Logger::log_data(pattern_str.str());
  }
}